

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O1

LPCSTR __thiscall NpyArray::LoadNPZ(NpyArray *this,string *filename,string *varname)

{
  LPCSTR pcVar1;
  int iVar2;
  char *pcVar3;
  FILE *fp;
  ScopeExitRun closeFp;
  FILE *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  function<void_()> local_38;
  
  if (('\0' < this->type) && (this->data != (uint8_t *)0x0)) {
    operator_delete__(this->data);
  }
  this->data = (uint8_t *)0x0;
  local_60 = fopen((filename->_M_dataplus)._M_p,"rb");
  if (local_60 == (FILE *)0x0) {
    pcVar3 = "error: unable to open file";
  }
  else {
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = &local_60;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:202:29)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/cdcseacave[P]TinyNPY/TinyNPY.cpp:202:29)>
               ::_M_manager;
    std::function<void_()>::function(&local_38,(function<void_()> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    do {
      pcVar1 = LoadArrayNPZ((FILE *)local_60,varname,this);
      iVar2 = 3;
      if ((pcVar1 != (LPCSTR)0x1) &&
         ((pcVar1 != (LPCSTR)0x0 || (iVar2 = 1, this->data == (uint8_t *)0x0)))) {
        iVar2 = 0;
      }
    } while (iVar2 == 0);
    if (iVar2 == 3) {
      pcVar3 = "error: variable name not found";
    }
    else {
      pcVar3 = (LPCSTR)0x0;
    }
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)&local_38);
  }
  return pcVar3;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, std::string varname)
{
	Release();
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		const LPCSTR ret = LoadArrayNPZ(fp, varname, *this);
		if (ret == NULL && !IsEmpty())
			return NULL;
		if (ret == (const char*)1)
			break;
	}
	return "error: variable name not found";
}